

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

bool cppcms::xss::validate_and_filter_if_invalid
               (char *begin,char *end,rules *r,string *output,filtering_method_type method,
               char repl_ch)

{
  char cVar1;
  html_data_type hVar2;
  char *pcVar3;
  pointer peVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  ulong uVar8;
  long lVar9;
  entry *part;
  ulong uVar10;
  uint uVar11;
  char *p;
  char *pcVar12;
  string real_encoding;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  parsed;
  string filtered;
  string work_input;
  string tmp;
  string filtered_input;
  string work_encoding;
  
  rules::encoding_abi_cxx11_(&real_encoding,r);
  std::__cxx11::string::string((string *)&work_encoding,(string *)&real_encoding);
  work_input._M_dataplus._M_p = (pointer)&work_input.field_2;
  work_input._M_string_length = 0;
  work_input.field_2._M_local_buf[0] = '\0';
  filtered_input._M_dataplus._M_p = (pointer)&filtered_input.field_2;
  filtered_input._M_string_length = 0;
  filtered._M_dataplus._M_p = (pointer)&filtered.field_2;
  filtered._M_string_length = 0;
  filtered_input.field_2._M_local_buf[0] = '\0';
  filtered.field_2._M_local_buf[0] = '\0';
  if (real_encoding._M_string_length == 0) {
    bVar5 = true;
  }
  else {
    bVar5 = encoding::is_ascii_compatible(&real_encoding);
    if (!bVar5) {
      std::__cxx11::string::assign((char *)&work_encoding);
      booster::locale::conv::to_utf<char>
                ((char *)&tmp,begin,(string *)end,(method_type)&real_encoding);
      std::__cxx11::string::swap((string *)&work_input);
      std::__cxx11::string::~string((string *)&tmp);
      end = work_input._M_dataplus._M_p + work_input._M_string_length;
      repl_ch = '\0';
      begin = (char *)work_input._M_dataplus;
    }
    bVar5 = true;
    bVar6 = encoding::validate_or_filter(&work_encoding,begin,end,&filtered_input,repl_ch);
    if (!bVar6) {
      end = filtered_input._M_dataplus._M_p + filtered_input._M_string_length;
      bVar5 = false;
      begin = (char *)filtered_input._M_dataplus;
    }
  }
  parsed.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsed.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parsed.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_8::split_to_parts(begin,end,&parsed);
  peVar4 = parsed.
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)parsed.
                 super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)parsed.
                super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x48;
  for (uVar11 = 0; uVar10 = (ulong)uVar11, uVar10 < uVar8; uVar11 = uVar11 + 1) {
    hVar2 = peVar4[uVar10].type;
    anon_unknown_8::parse_part(peVar4 + uVar10);
    bVar5 = (bool)(hVar2 != invalid_data & bVar5 & peVar4[uVar10].type != invalid_data);
  }
  anon_unknown_8::validate_nesting(&parsed,((r->d).ptr_)->is_xhtml);
  for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
    bVar5 = (bool)(bVar5 & peVar4[uVar11].type != invalid_data);
  }
  for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
    part = peVar4 + uVar11;
    bVar6 = anon_unknown_8::validate_entry_by_rules(part,r);
    if (!bVar6) {
      lVar9 = (long)(part->tag).pair;
      if (lVar9 != -1) {
        peVar4[lVar9].type = invalid_data;
      }
      part->type = invalid_data;
      bVar5 = false;
    }
  }
  if (!bVar5) {
    filtered._M_string_length = 0;
    *filtered._M_dataplus._M_p = '\0';
    std::__cxx11::string::reserve((ulong)&filtered);
    for (uVar11 = 0; uVar10 = (ulong)uVar11, uVar10 < uVar8; uVar11 = uVar11 + 1) {
      pcVar12 = peVar4[uVar10].begin;
      pcVar3 = peVar4[uVar10].end;
      if (peVar4[uVar10].type == invalid_data) {
        if (method != remove_invalid) {
          for (; pcVar12 != pcVar3; pcVar12 = pcVar12 + 1) {
            cVar1 = *pcVar12;
            if ((((cVar1 == '\"') || (cVar1 == '&')) || (cVar1 == '>')) || (cVar1 == '<')) {
              std::__cxx11::string::append((char *)&filtered);
            }
            else {
              std::__cxx11::string::push_back((char)&filtered);
            }
          }
        }
      }
      else {
        std::__cxx11::string::append((char *)&filtered,(ulong)pcVar12);
      }
    }
    _Var7 = std::operator==(&work_encoding,&real_encoding);
    if (_Var7) {
      std::__cxx11::string::swap((string *)output);
    }
    else {
      booster::locale::conv::from_utf<char>(&tmp,&filtered,&real_encoding,stop);
      std::__cxx11::string::swap((string *)output);
      std::__cxx11::string::~string((string *)&tmp);
    }
  }
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::~vector(&parsed);
  std::__cxx11::string::~string((string *)&filtered);
  std::__cxx11::string::~string((string *)&filtered_input);
  std::__cxx11::string::~string((string *)&work_input);
  std::__cxx11::string::~string((string *)&work_encoding);
  std::__cxx11::string::~string((string *)&real_encoding);
  return bVar5;
}

Assistant:

bool validate_and_filter_if_invalid(	char const *begin,
						char const *end,
						rules const &r,
						std::string &output,
						filtering_method_type method,
						char repl_ch)
	{
		bool valid = true;
		
		std::string real_encoding = r.encoding();
		std::string work_encoding = real_encoding;

		std::string work_input;
		std::string filtered_input;
		std::string filtered;

		if(!real_encoding.empty()) {
			if(!encoding::is_ascii_compatible(real_encoding)) { 
				work_encoding = "UTF-8";
				repl_ch = 0;
				try {
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,
							end,
							real_encoding,
							booster::locale::conv::stop
							);
					work_input.swap(tmp);
				}
				catch(...) {
					valid = false;
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,
							end,
							real_encoding,
							booster::locale::conv::skip
							);
					work_input.swap(tmp);
				}
				begin = work_input.c_str();
				end = begin + work_input.size();
			}

			if(!encoding::validate_or_filter(work_encoding,begin,end,filtered_input,repl_ch)) {
				valid = false;
				begin = filtered_input.c_str();
				end = begin + filtered_input.size();
			}
		}

		std::vector<entry> parsed;
		
		split_to_parts(begin,end,parsed);

		size_t size = parsed.size();

		for(unsigned i=0;i<size;i++) {
			if(parsed[i].type == invalid_data)
				valid = false;
			parse_part(parsed[i]);
			if(parsed[i].type == invalid_data)
				valid = false;
		}

		validate_nesting(parsed,r.html() == rules::xhtml_input);

		for(unsigned i=0;i<size;i++)
			if(parsed[i].type == invalid_data)
				valid = false;

		for(unsigned i=0;i<size;i++) {
			if(!validate_entry_by_rules(parsed[i],r)) {
				valid = false;
				int pair = parsed[i].tag.pair;
				if(pair!=-1)
					parsed[pair].type = invalid_data;
				parsed[i].type = invalid_data;
			}
		}
		if(valid)
			return true;
		
		filtered.clear();
		filtered.reserve(end-begin);
		
		for(unsigned i=0;i<size;i++) {
			char const *b=parsed[i].begin;
			char const *e=parsed[i].end;
			if(parsed[i].type == invalid_data) {
				if(method == remove_invalid)
					continue;
				for(char const *p=b;p!=e;p++) {
					char c=*p;
					switch(c) {
					case '<':
						filtered+="&lt;";
						break;
					case '>':
						filtered+="&gt;";
						break;
					case '&':
						filtered+="&amp;";
						break;
					case '"':
						filtered+="&quot;";
						break;
					default:
						filtered+=c;
					}
				}
			}
			else {
				filtered.append(b,e-b);
			}
		}

		if(work_encoding == real_encoding) {
			output.swap(filtered);
		}
		else {
			try {
				std::string tmp = booster::locale::conv::from_utf<char>(
						filtered,
						real_encoding,
						booster::locale::conv::stop);
				output.swap(tmp);
			}
			catch(...) {
				// Nothing to do
			}
		}
		return false;
	}